

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall wasm::OptimizeInstructions::visitCallRef(OptimizeInstructions *this,CallRef *curr)

{
  Name target;
  string_view table;
  CallRef *curr_00;
  bool bVar1;
  Module *pMVar2;
  Call *pCVar3;
  ExpressionList *args;
  CallIndirect *rep;
  Expression *pEVar4;
  Drop *left;
  Expression **ppEVar5;
  Function *pFVar6;
  LocalGet *get_00;
  Block *pBVar7;
  PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_> *this_00;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  anon_class_1_0_00000001 local_1d9;
  function<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*)>
  local_1d8;
  Expression *local_1b8;
  Expression *calls;
  size_t local_1a8;
  char *local_1a0;
  optional<wasm::Type> local_190;
  Drop *local_180;
  Expression *local_178;
  Expression *local_170;
  initializer_list<wasm::Expression_*> local_168;
  uintptr_t local_158;
  Expression *local_150;
  Expression *get_1;
  Drop *drop;
  LocalSet *set;
  uintptr_t local_130;
  uintptr_t local_128;
  Index local_11c;
  uintptr_t uStack_118;
  Index tempLocal;
  BasicType local_10c;
  Type local_108;
  Type lastOperandType;
  Expression *lastOperand;
  undefined1 local_f0 [2] [12];
  uintptr_t local_d0;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_c8;
  size_t local_a8;
  char *pcStack_a0;
  Builder local_98;
  Builder builder;
  HeapType local_88;
  RefFunc *local_80;
  RefFunc *ref_1;
  HeapType HStack_70;
  FeatureSet features;
  Builder local_58;
  TableGet *local_50;
  TableGet *get;
  size_t local_40;
  char *local_38;
  Builder local_30;
  RefFunc *local_28;
  RefFunc *ref;
  CallRef *local_18;
  CallRef *curr_local;
  OptimizeInstructions *this_local;
  
  local_18 = curr;
  curr_local = (CallRef *)this;
  skipNonNullCast(this,&curr->target,(Expression *)curr);
  bVar1 = trapOnNull(this,(Expression *)local_18,&local_18->target);
  if (!bVar1) {
    ref._4_4_ = 1;
    bVar1 = wasm::Type::operator==(&local_18->target->type,(BasicType *)((long)&ref + 4));
    if (!bVar1) {
      local_28 = Expression::dynCast<wasm::RefFunc>(local_18->target);
      if (local_28 == (RefFunc *)0x0) {
        local_50 = Expression::dynCast<wasm::TableGet>(local_18->target);
        if (local_50 == (TableGet *)0x0) {
          pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   ::getModule(&(this->
                                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                ).
                                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .
                                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              );
          ref_1._4_4_ = (pMVar2->features).features;
          pEVar4 = getFallthrough(this,local_18->target);
          local_80 = Expression::dynCast<wasm::RefFunc>(pEVar4);
          curr_00 = local_18;
          if (local_80 == (RefFunc *)0x0) {
            std::
            function<std::variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>(wasm::Expression*)>
            ::
            function<wasm::OptimizeInstructions::visitCallRef(wasm::CallRef*)::_lambda(wasm::Expression*)_1_,void>
                      ((function<std::variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>(wasm::Expression*)>
                        *)&local_1d8,&local_1d9);
            this_00 = &(this->
                       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                       ).
                       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
            ;
            pFVar6 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                     ::getFunction(&this_00->
                                    super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  );
            pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                     ::getModule(&this_00->
                                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                );
            pEVar4 = CallUtils::convertToDirectCalls<wasm::CallRef>
                               (curr_00,&local_1d8,pFVar6,pMVar2);
            std::
            function<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*)>
            ::~function(&local_1d8);
            if (pEVar4 != (Expression *)0x0) {
              local_1b8 = pEVar4;
              replaceCurrent(this,pEVar4);
            }
          }
          else {
            local_88 = wasm::Type::getHeapType(&local_18->target->type);
            builder.wasm = (Module *)
                           wasm::Type::getHeapType
                                     (&(local_80->super_SpecificExpression<(wasm::Expression::Id)43>
                                       ).super_Expression.type);
            bVar1 = HeapType::operator!=(&local_88,(HeapType *)&builder);
            if (!bVar1) {
              pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       ::getModule(&(this->
                                    super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                    ).
                                    super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                    .
                                    super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  );
              Builder::Builder(&local_98,pMVar2);
              bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::empty
                                (&(local_18->operands).
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                );
              if (bVar1) {
                left = Builder::makeDrop(&local_98,local_18->target);
                local_a8 = (local_80->func).super_IString.str._M_len;
                pcStack_a0 = (local_80->func).super_IString.str._M_str;
                local_c8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_c8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_c8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                          (&local_c8);
                local_d0 = (local_18->super_SpecificExpression<(wasm::Expression::Id)61>).
                           super_Expression.type.id;
                target.super_IString.str._M_str = pcStack_a0;
                target.super_IString.str._M_len = local_a8;
                pCVar3 = Builder::makeCall(&local_98,target,&local_c8,(Type)local_d0,
                                           (bool)(local_18->isReturn & 1));
                std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_f0);
                type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._12_4_ = 0;
                type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._M_payload =
                     (_Storage<wasm::Type,_true>)local_f0[0]._0_8_;
                type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_f0[0][8];
                type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._9_3_ = local_f0[0]._9_3_;
                pBVar7 = Builder::makeSequence
                                   (&local_98,(Expression *)left,(Expression *)pCVar3,type_00);
                replaceCurrent(this,(Expression *)pBVar7);
                std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                          (&local_c8);
              }
              else {
                ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                                    (&(local_18->operands).
                                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                    );
                lastOperandType.id = (uintptr_t)*ppEVar5;
                local_108.id = (((Expression *)lastOperandType.id)->type).id;
                local_10c = unreachable;
                bVar1 = wasm::Type::operator==(&local_108,&local_10c);
                if (!bVar1) {
                  uStack_118 = local_108.id;
                  bVar1 = TypeUpdating::canHandleAsLocal(local_108);
                  if (bVar1) {
                    pFVar6 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             ::getFunction(&(this->
                                            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                            ).
                                            super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                            .
                                            super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                          );
                    local_130 = local_108.id;
                    set._4_4_ = ref_1._4_4_;
                    local_128 = (uintptr_t)TypeUpdating::getValidLocalType(local_108,ref_1._4_4_);
                    local_11c = Builder::addVar(pFVar6,(Type)local_128);
                    drop = (Drop *)Builder::makeLocalSet
                                             (&local_98,local_11c,(Expression *)lastOperandType.id);
                    get_1 = (Expression *)Builder::makeDrop(&local_98,local_18->target);
                    local_158 = local_108.id;
                    get_00 = Builder::makeLocalGet(&local_98,local_11c,local_108);
                    pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             ::getModule(&(this->
                                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                          .
                                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                        );
                    local_170 = TypeUpdating::fixLocalGet(get_00,pMVar2);
                    local_180 = drop;
                    local_178 = get_1;
                    local_168._M_array = (iterator)&local_180;
                    local_168._M_len = 3;
                    local_150 = local_170;
                    std::optional<wasm::Type>::optional(&local_190);
                    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
                    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._M_payload =
                         local_190.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Type>._M_payload;
                    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._M_engaged =
                         local_190.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Type>._M_engaged;
                    pBVar7 = Builder::makeBlock(&local_98,&local_168,type);
                    ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                              back(&(local_18->operands).
                                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  );
                    *ppEVar5 = (Expression *)pBVar7;
                    local_1a8 = (local_80->func).super_IString.str._M_len;
                    local_1a0 = (local_80->func).super_IString.str._M_str;
                    calls = (Expression *)
                            (local_18->super_SpecificExpression<(wasm::Expression::Id)61>).
                            super_Expression.type.id;
                    pCVar3 = Builder::makeCall<ArenaVector<wasm::Expression*>>
                                       (&local_98,(Name)(local_80->func).super_IString.str,
                                        &local_18->operands,(Type)calls,
                                        (bool)(local_18->isReturn & 1));
                    replaceCurrent(this,(Expression *)pCVar3);
                  }
                }
              }
            }
          }
        }
        else {
          pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   ::getModule(&(this->
                                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                ).
                                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .
                                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              );
          Builder::Builder(&local_58,pMVar2);
          table = (local_50->table).super_IString.str;
          pEVar4 = local_50->index;
          args = &local_18->operands;
          HStack_70 = wasm::Type::getHeapType
                                (&(local_50->super_SpecificExpression<(wasm::Expression::Id)45>).
                                  super_Expression.type);
          rep = Builder::makeCallIndirect<ArenaVector<wasm::Expression*>>
                          (&local_58,(Name)table,pEVar4,args,HStack_70,
                           (bool)(local_18->isReturn & 1));
          replaceCurrent(this,(Expression *)rep);
        }
      }
      else {
        pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 ::getModule(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                              ).
                              super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              .
                              super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            );
        Builder::Builder(&local_30,pMVar2);
        local_40 = (local_28->func).super_IString.str._M_len;
        local_38 = (local_28->func).super_IString.str._M_str;
        get = (TableGet *)
              (local_18->super_SpecificExpression<(wasm::Expression::Id)61>).super_Expression.type.
              id;
        pCVar3 = Builder::makeCall<ArenaVector<wasm::Expression*>>
                           (&local_30,(Name)(local_28->func).super_IString.str,&local_18->operands,
                            (Type)get,(bool)(local_18->isReturn & 1));
        replaceCurrent(this,(Expression *)pCVar3);
      }
    }
  }
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
    skipNonNullCast(curr->target, curr);
    if (trapOnNull(curr, curr->target)) {
      return;
    }
    if (curr->target->type == Type::unreachable) {
      // The call_ref is not reached; leave this for DCE.
      return;
    }

    if (auto* ref = curr->target->dynCast<RefFunc>()) {
      // We know the target!
      replaceCurrent(
        Builder(*getModule())
          .makeCall(ref->func, curr->operands, curr->type, curr->isReturn));
      return;
    }

    if (auto* get = curr->target->dynCast<TableGet>()) {
      // (call_ref ..args.. (table.get $table (index))
      //   =>
      // (call_indirect $table ..args.. (index))
      replaceCurrent(Builder(*getModule())
                       .makeCallIndirect(get->table,
                                         get->index,
                                         curr->operands,
                                         get->type.getHeapType(),
                                         curr->isReturn));
      return;
    }

    auto features = getModule()->features;

    // It is possible the target is not a function reference, but we can infer
    // the fallthrough value there. It takes more work to optimize this case,
    // but it is pretty important to allow a call_ref to become a fast direct
    // call, so make the effort.
    if (auto* ref = getFallthrough(curr->target)->dynCast<RefFunc>()) {
      // Check if the fallthrough make sense. We may have cast it to a different
      // type, which would be a problem - we'd be replacing a call_ref to one
      // type with a direct call to a function of another type. That would trap
      // at runtime; be careful not to emit invalid IR here.
      if (curr->target->type.getHeapType() != ref->type.getHeapType()) {
        return;
      }
      Builder builder(*getModule());
      if (curr->operands.empty()) {
        // No operands, so this is simple and there is nothing to reorder: just
        // emit:
        //
        // (block
        //  (drop curr->target)
        //  (call ref.func-from-curr->target)
        // )
        replaceCurrent(builder.makeSequence(
          builder.makeDrop(curr->target),
          builder.makeCall(ref->func, {}, curr->type, curr->isReturn)));
        return;
      }

      // In the presence of operands, we must execute the code in curr->target
      // after the last operand and before the call happens. Interpose at the
      // last operand:
      //
      // (call ref.func-from-curr->target)
      //  (operand1)
      //  (..)
      //  (operandN-1)
      //  (block
      //   (local.set $temp (operandN))
      //   (drop curr->target)
      //   (local.get $temp)
      //  )
      // )
      auto* lastOperand = curr->operands.back();
      auto lastOperandType = lastOperand->type;
      if (lastOperandType == Type::unreachable) {
        // The call_ref is not reached; leave this for DCE.
        return;
      }
      if (!TypeUpdating::canHandleAsLocal(lastOperandType)) {
        // We cannot create a local, so we must give up.
        return;
      }
      Index tempLocal = builder.addVar(
        getFunction(),
        TypeUpdating::getValidLocalType(lastOperandType, features));
      auto* set = builder.makeLocalSet(tempLocal, lastOperand);
      auto* drop = builder.makeDrop(curr->target);
      auto* get = TypeUpdating::fixLocalGet(
        builder.makeLocalGet(tempLocal, lastOperandType), *getModule());
      curr->operands.back() = builder.makeBlock({set, drop, get});
      replaceCurrent(builder.makeCall(
        ref->func, curr->operands, curr->type, curr->isReturn));
      return;
    }

    // If the target is a select of two different constants, we can emit an if
    // over two direct calls.
    if (auto* calls = CallUtils::convertToDirectCalls(
          curr,
          [](Expression* target) -> CallUtils::IndirectCallInfo {
            if (auto* refFunc = target->dynCast<RefFunc>()) {
              return CallUtils::Known{refFunc->func};
            }
            return CallUtils::Unknown{};
          },
          *getFunction(),
          *getModule())) {
      replaceCurrent(calls);
    }
  }